

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedPrimitiveFieldGenerator::
RepeatedPrimitiveFieldGenerator
          (RepeatedPrimitiveFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  char *pcVar1;
  long lVar2;
  mapped_type *pmVar3;
  undefined8 *in_RDI;
  string base_name;
  char *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  allocator *paVar4;
  key_type *in_stack_fffffffffffffe58;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  Options *in_stack_fffffffffffffe70;
  FieldDescriptor *in_stack_fffffffffffffe78;
  RepeatedFieldGenerator *in_stack_fffffffffffffe80;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [24];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffed8;
  FieldDescriptor *in_stack_fffffffffffffee0;
  string local_100 [39];
  undefined1 local_d9 [40];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [39];
  allocator local_49;
  string local_48 [72];
  
  RepeatedFieldGenerator::RepeatedFieldGenerator
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  *in_RDI = &PTR__RepeatedPrimitiveFieldGenerator_00898128;
  anon_unknown_5::SetPrimitiveVariables(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  pcVar1 = anon_unknown_5::PrimitiveArrayTypeName(in_stack_fffffffffffffe78);
  paVar4 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    __k = (key_type *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_d9 + 1),"array_storage_type",(allocator *)__k);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffe60,__k);
    std::__cxx11::string::operator=((string *)pmVar3,"NSMutableArray");
    std::__cxx11::string::~string((string *)(local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"storage_type",&local_141);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffe60,__k);
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    paVar4 = &local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"array_property_type",paVar4);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffe60,__k);
    std::__cxx11::string::operator=((string *)pmVar3,local_100);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  else {
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    paVar4 = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"array_storage_type",paVar4);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::operator=((string *)pmVar3,local_70);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  SetPrimitiveVariables(descriptor, &variables_);

  string base_name = PrimitiveArrayTypeName(descriptor);
  if (base_name.length()) {
    variables_["array_storage_type"] = "GPB" + base_name + "Array";
  } else {
    variables_["array_storage_type"] = "NSMutableArray";
    variables_["array_property_type"] =
        "NSMutableArray<" + variables_["storage_type"] + "*>";
  }
}